

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageTest.cpp
# Opt level: O0

void __thiscall BaseImageTests::buffer_access::test_method(buffer_access *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  lazy_ostream *plVar4;
  out_of_range *ex_2;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[52],_const_char_(&)[52]> local_338;
  assertion_result local_318;
  basic_cstring<const_char> local_300;
  basic_cstring<const_char> local_2f0;
  basic_cstring<const_char> local_2e0;
  basic_cstring<const_char> local_2d0 [8];
  out_of_range *ex_1;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[52],_const_char_(&)[52]> local_240;
  assertion_result local_220;
  basic_cstring<const_char> local_208;
  basic_cstring<const_char> local_1f8;
  basic_cstring<const_char> local_1e8;
  basic_cstring<const_char> local_1d8 [8];
  out_of_range *ex;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[52],_const_char_(&)[52]> local_148;
  assertion_result local_128;
  basic_cstring<const_char> local_110;
  basic_cstring<const_char> local_100;
  basic_cstring<const_char> local_f0;
  basic_cstring<const_char> local_e0;
  basic_cstring<const_char> local_d0;
  basic_cstring<const_char> local_c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_b0;
  assertion_result local_90;
  basic_cstring<const_char> local_78 [2];
  basic_cstring<const_char> local_58;
  undefined1 local_48 [8];
  Image img1;
  buffer_access *this_local;
  
  img1.pixels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  SimpleCV::Core::Image::Image((Image *)local_48,1,1,0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
               ,0x61);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(local_78);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_58,0x1d,local_78);
    iVar3 = SimpleCV::Core::Image::getPixel((Image *)local_48,0,0);
    boost::test_tools::assertion_result::assertion_result(&local_90,iVar3 == 0);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c0,"img1.getPixel(0, 0) == 0",0x18);
    boost::unit_test::operator<<(&local_b0,plVar4,&local_c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
               ,0x61);
    boost::test_tools::tt_detail::report_assertion(&local_90,&local_b0,&local_d0,0x1d,2,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_b0);
    boost::test_tools::assertion_result::~assertion_result(&local_90);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
               ,0x61);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e0,0x1e,&local_f0);
    SimpleCV::Core::Image::getPixel((Image *)local_48,2,0);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_100,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
                 ,0x61);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_110);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_100,0x1e,&local_110);
      boost::test_tools::assertion_result::assertion_result(&local_128,false);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_148,plVar4,
                 (char (*) [52])"exception std::out_of_range expected but not raised");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
                 ,0x61);
      boost::test_tools::tt_detail::report_assertion(&local_128,&local_148,&ex,0x1e,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[52],_const_char_(&)[52]>::
      ~lazy_ostream_impl(&local_148);
      boost::test_tools::assertion_result::~assertion_result(&local_128);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_1d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
               ,0x61);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_1d8,0x1f,&local_1e8);
    SimpleCV::Core::Image::getPixel((Image *)local_48,0,2);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1f8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
                 ,0x61);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_208);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1f8,0x1f,&local_208);
      boost::test_tools::assertion_result::assertion_result(&local_220,false);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_240,plVar4,
                 (char (*) [52])"exception std::out_of_range expected but not raised");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex_1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
                 ,0x61);
      boost::test_tools::tt_detail::report_assertion(&local_220,&local_240,&ex_1,0x1f,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[52],_const_char_(&)[52]>::
      ~lazy_ostream_impl(&local_240);
      boost::test_tools::assertion_result::~assertion_result(&local_220);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_2d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
               ,0x61);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_2d0,0x20,&local_2e0);
    SimpleCV::Core::Image::getPixel((Image *)local_48,-1,0);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2f0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
                 ,0x61);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_300);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2f0,0x20,&local_300);
      boost::test_tools::assertion_result::assertion_result(&local_318,false);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_338,plVar4,
                 (char (*) [52])"exception std::out_of_range expected but not raised");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex_2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
                 ,0x61);
      boost::test_tools::tt_detail::report_assertion(&local_318,&local_338,&ex_2,0x20,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[52],_const_char_(&)[52]>::
      ~lazy_ostream_impl(&local_338);
      boost::test_tools::assertion_result::~assertion_result(&local_318);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  SimpleCV::Core::Image::~Image((Image *)local_48);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(buffer_access)
{
	Image img1(1, 1);
	BOOST_REQUIRE(img1.getPixel(0, 0) == 0);
	BOOST_CHECK_THROW(img1.getPixel(2, 0), std::out_of_range);
	BOOST_CHECK_THROW(img1.getPixel(0, 2), std::out_of_range);
	BOOST_CHECK_THROW(img1.getPixel(-1, 0), std::out_of_range);
}